

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBblif.c
# Opt level: O2

Bbl_Man_t * Bbl_ManFromAbc(Abc_Ntk_t *pNtk)

{
  Bbl_Man_t *p;
  Vec_Ptr_t *p_00;
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    p = Bbl_ManStart(pNtk->pName);
    p_00 = Abc_NtkDfs(pNtk,0);
    for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
      pvVar1 = Vec_PtrEntry(pNtk->vCis,iVar5);
      Bbl_ManCreateObject(p,BBL_OBJ_CI,*(int *)((long)pvVar1 + 0x10),0,(char *)0x0);
    }
    for (iVar5 = 0; iVar5 < p_00->nSize; iVar5 = iVar5 + 1) {
      pvVar1 = Vec_PtrEntry(p_00,iVar5);
      Bbl_ManCreateObject(p,BBL_OBJ_NODE,*(int *)((long)pvVar1 + 0x10),*(int *)((long)pvVar1 + 0x1c)
                          ,*(char **)((long)pvVar1 + 0x38));
    }
    for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,iVar5);
      Bbl_ManCreateObject(p,BBL_OBJ_CO,pAVar2->Id,1,(char *)0x0);
    }
    for (iVar5 = 0; iVar5 < p_00->nSize; iVar5 = iVar5 + 1) {
      plVar3 = (long *)Vec_PtrEntry(p_00,iVar5);
      for (lVar4 = 0; lVar4 < *(int *)((long)plVar3 + 0x1c); lVar4 = lVar4 + 1) {
        Bbl_ManAddFanin(p,(int)plVar3[2],
                        *(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                          (long)*(int *)(plVar3[4] + lVar4 * 4) * 8) + 0x10));
      }
    }
    for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,iVar5);
      for (lVar4 = 0; lVar4 < (pAVar2->vFanins).nSize; lVar4 = lVar4 + 1) {
        Bbl_ManAddFanin(p,pAVar2->Id,
                        *(int *)((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar4]]
                                + 0x10));
      }
    }
    free(p_00->pArray);
    free(p_00);
    Bbl_ManCheck(p);
    return p;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBblif.c"
                ,0x3c,"Bbl_Man_t *Bbl_ManFromAbc(Abc_Ntk_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


// For description of Binary BLIF format, refer to "abc/src/aig/bbl/bblif.h"

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Fnction*************************************************************

  Synopsis    [Construct manager from the ABC network.]

  Description [In the ABC network each object has a unique integer ID.
  This ID is used when we construct objects of the BBLIF manager 
  corresponding to each object of the ABC network. The objects can be
  added to the manager in any order (although below they are added in the
  topological order), but by the time fanin/fanout connections are created, 
  corresponding objects are already constructed. In the end the checking
  procedure is called.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Bbl_Man_t * Bbl_ManFromAbc( Abc_Ntk_t * pNtk )
{
    Bbl_Man_t * p;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // start the data manager
    p = Bbl_ManStart( Abc_NtkName(pNtk) );
    // collect internal nodes to be added
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // create combinational inputs
    Abc_NtkForEachCi( pNtk, pObj, i )
        Bbl_ManCreateObject( p, BBL_OBJ_CI, Abc_ObjId(pObj), 0, NULL );
    // create internal nodes 
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Bbl_ManCreateObject( p, BBL_OBJ_NODE, Abc_ObjId(pObj), Abc_ObjFaninNum(pObj), (char *)pObj->pData );
    // create combinational outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Bbl_ManCreateObject( p, BBL_OBJ_CO, Abc_ObjId(pObj), 1, NULL );
    // create fanin/fanout connections for internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Bbl_ManAddFanin( p, Abc_ObjId(pObj), Abc_ObjId(pFanin) );
    // create fanin/fanout connections for combinational outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Bbl_ManAddFanin( p, Abc_ObjId(pObj), Abc_ObjId(pFanin) );
    Vec_PtrFree( vNodes );
    // sanity check
    Bbl_ManCheck( p );
    return p;
}